

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle,void *callbackCtx)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  IOTHUB_MESSAGE_RESULT IVar8;
  MAP_RESULT MVar9;
  int iVar10;
  QOS_VALUE QVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  LOGGER_LOG p_Var15;
  STRING_TOKENIZER_HANDLE_conflict pSVar16;
  STRING_HANDLE pSVar17;
  undefined8 *__ptr;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  char *pcVar18;
  size_t sVar19;
  int *piVar20;
  MAP_HANDLE handle;
  STRING_HANDLE pSVar21;
  STRING_HANDLE pSVar22;
  MESSAGE_DISPOSITION_CONTEXT_HANDLE dispositionContext;
  APP_PAYLOAD *pAVar23;
  size_t sVar24;
  IOTHUB_SYSTEM_PROPERTY_TYPE propertyType;
  uint unaff_R12D;
  PDLIST_ENTRY Entry;
  char *unaff_R15;
  long lVar25;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar26;
  ulong local_68;
  ulong local_60;
  int local_58;
  
  uVar26 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (callbackCtx == (void *)0x0 || msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
    return MQTT_CLIENT_ACK_NONE;
  }
  pcVar12 = mqttmessage_getTopicName(msgHandle);
  if (pcVar12 == (char *)0x0) {
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar12 = "mqttNotificationCallback";
    pcVar13 = "Failure: NULL topic name encountered";
    iVar6 = 0x7f8;
    goto LAB_0012e68f;
  }
  iVar6 = InternStrnicmp(pcVar12,"$iothub/twin",0xc);
  bVar3 = true;
  if (iVar6 == 0) {
    iVar6 = 1;
LAB_0012e5df:
    unaff_R12D = 0;
  }
  else {
    iVar6 = InternStrnicmp(pcVar12,"$iothub/methods",0xf);
    if (iVar6 == 0) {
      iVar6 = 2;
      goto LAB_0012e5df;
    }
    pcVar13 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 8));
    if (pcVar13 == (char *)0x0) {
LAB_0012e533:
      pcVar13 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 0x20));
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        iVar6 = InternStrnicmp(pcVar12,pcVar13,sVar14 - 1);
        unaff_R15 = pcVar13;
        if (iVar6 == 0) {
          iVar6 = 3;
          unaff_R12D = 1;
          bVar3 = true;
          goto LAB_0012e5fc;
        }
      }
      iVar6 = (int)unaff_R15;
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        pcVar13 = pcVar12;
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"retrieveTopicType",0x29d,1,
                   "Topic %s does not match any client is subscribed to",pcVar12);
        uVar26 = (undefined4)((ulong)pcVar13 >> 0x20);
      }
      bVar3 = false;
    }
    else {
      sVar14 = strlen(pcVar13);
      iVar6 = InternStrnicmp(pcVar12,pcVar13,sVar14 - 1);
      unaff_R15 = pcVar13;
      if (iVar6 != 0) goto LAB_0012e533;
      unaff_R12D = 0;
      iVar6 = 0;
    }
  }
LAB_0012e5fc:
  if (!bVar3) {
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar12 = "mqttNotificationCallback";
    pcVar13 = "Received unexpected topic.  Ignoring remainder of request";
    iVar6 = 0x7fc;
    goto LAB_0012e68f;
  }
  if (iVar6 == 2) {
    pSVar17 = STRING_new();
    if (pSVar17 == (STRING_HANDLE)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) {
        return MQTT_CLIENT_ACK_NONE;
      }
      pcVar12 = "processDeviceMethodNotification";
      pcVar13 = "Failure: allocating method_name string value";
      iVar6 = 0x76c;
      goto LAB_0012e68f;
    }
    __ptr = (undefined8 *)malloc(8);
    if (__ptr == (undefined8 *)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012eae4;
      pcVar12 = "Failure: allocating DEVICE_METHOD_INFO object";
      iVar6 = 0x773;
LAB_0012e896:
      (*p_Var15)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"processDeviceMethodNotification",iVar6,1,pcVar12);
      goto LAB_0012eae4;
    }
    pSVar21 = STRING_new();
    *__ptr = pSVar21;
    if (pSVar21 == (STRING_HANDLE)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"processDeviceMethodNotification",0x77a,1,
                   "Failure constructing request_id string");
      }
    }
    else {
      pSVar16 = STRING_TOKENIZER_create_from_char(pcVar12);
      if (pSVar16 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"retrieveDeviceMethodRidInfo",0x1f8,1,
                     "Failed creating token from device twin topic.");
        }
LAB_0012ea9f:
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          pcVar12 = "Failure: retrieve device topic info";
          iVar6 = 0x77f;
LAB_0012eac8:
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processDeviceMethodNotification",iVar6,1,pcVar12);
        }
      }
      else {
        pSVar22 = STRING_new();
        if (pSVar22 == (STRING_HANDLE)0x0) {
          p_Var15 = xlogging_get_log_function();
          if (p_Var15 != (LOGGER_LOG)0x0) {
            (*p_Var15)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"retrieveDeviceMethodRidInfo",0x200,1,"Failed allocating new string .");
          }
LAB_0012ea92:
          STRING_TOKENIZER_destroy(pSVar16);
          goto LAB_0012ea9f;
        }
        iVar6 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar22,"/");
        if (iVar6 != 0) {
LAB_0012e72e:
          STRING_delete(pSVar22);
          goto LAB_0012ea92;
        }
        local_58 = 0x207;
        lVar25 = 0;
        do {
          if (lVar25 == 4) {
            sVar19 = STRING_length(pSVar22);
            if (5 < sVar19) {
              piVar20 = (int *)STRING_c_str(pSVar22);
              iVar6 = *piVar20;
              bVar3 = (short)piVar20[1] == 0x3d64;
              if (bVar3 && iVar6 == 0x6972243f) {
                iVar10 = STRING_concat(pSVar21,(char *)((long)piVar20 + 6));
                if (iVar10 == 0) {
                  local_58 = 0;
                }
                else {
                  p_Var15 = xlogging_get_log_function();
                  local_58 = 0x21d;
                  if (p_Var15 != (LOGGER_LOG)0x0) {
                    (*p_Var15)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"retrieveDeviceMethodRidInfo",0x21c,1,"Failed STRING_concat failed."
                              );
                  }
                }
              }
              if (bVar3 && iVar6 == 0x6972243f) break;
            }
          }
          else if ((lVar25 == 3) && (iVar6 = STRING_concat_with_STRING(pSVar17,pSVar22), iVar6 != 0)
                  ) {
            p_Var15 = xlogging_get_log_function();
            if (p_Var15 != (LOGGER_LOG)0x0) {
              (*p_Var15)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"retrieveDeviceMethodRidInfo",0x20e,1,"Failed STRING_concat_with_STRING.")
              ;
            }
            goto LAB_0012e72e;
          }
          lVar25 = lVar25 + 1;
          iVar6 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar22,"/");
        } while (iVar6 == 0);
        STRING_delete(pSVar22);
        STRING_TOKENIZER_destroy(pSVar16);
        if (local_58 != 0) goto LAB_0012ea9f;
        pAVar23 = mqttmessage_getApplicationMsg(msgHandle);
        if (pAVar23 != (APP_PAYLOAD *)0x0) {
          pcVar2 = *(code **)((long)callbackCtx + 0x158);
          pcVar12 = STRING_c_str(pSVar17);
          iVar6 = (*pcVar2)(pcVar12,pAVar23->message,pAVar23->length,__ptr,
                            *(undefined8 *)((long)callbackCtx + 0x168));
          if ((iVar6 == 0) || (p_Var15 = xlogging_get_log_function(), p_Var15 == (LOGGER_LOG)0x0))
          goto LAB_0012eae4;
          pcVar12 = "Failure: IoTHubClientCore_LL_DeviceMethodComplete";
          iVar6 = 0x78e;
          goto LAB_0012e896;
        }
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          pcVar12 = "Failure: mqttmessage_getApplicationMsg";
          iVar6 = 0x788;
          goto LAB_0012eac8;
        }
      }
      STRING_delete((STRING_HANDLE)*__ptr);
    }
    free(__ptr);
LAB_0012eae4:
    STRING_delete(pSVar17);
    return MQTT_CLIENT_ACK_NONE;
  }
  if (iVar6 == 1) {
    pSVar16 = STRING_TOKENIZER_create_from_char(pcVar12);
    if (pSVar16 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"parseDeviceTwinTopicInfo",0x23a,1,
                   "Failed creating token from device twin topic.");
      }
      pcVar12 = (char *)0x0;
      local_68 = 0;
      local_60 = 0;
      cVar4 = '\0';
    }
    else {
      pSVar17 = STRING_new();
      if (pSVar17 == (STRING_HANDLE)0x0) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"parseDeviceTwinTopicInfo",0x245,1,"Failed allocating new string .");
        }
        pcVar12 = (char *)0x0;
        local_68 = 0;
        local_60 = 0;
        cVar4 = '\0';
      }
      else {
        uVar7 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar17,"/");
        local_68 = (ulong)uVar7;
        lVar25 = 0;
        local_60 = local_68;
        if (uVar7 == 0) {
          do {
            if (lVar25 == 2) {
              pcVar12 = STRING_c_str(pSVar17);
              iVar6 = strcmp(pcVar12,"PATCH");
              if (iVar6 == 0) {
                local_60 = 1;
                pcVar12 = (char *)0x0;
                local_68 = 0;
                lVar25 = 1;
                goto LAB_0012f6b8;
              }
            }
            else if (lVar25 == 3) {
              pcVar12 = STRING_c_str(pSVar17);
              local_68 = atol(pcVar12);
            }
            else if (lVar25 == 4) {
              pcVar12 = STRING_c_str(pSVar17);
              iVar6 = strncmp(pcVar12,"?$rid=",6);
              if (iVar6 == 0) {
                pcVar12 = (char *)atol(pcVar12 + 6);
                lVar25 = 1;
                local_60 = 0;
                goto LAB_0012f6b8;
              }
              p_Var15 = xlogging_get_log_function();
              if (p_Var15 != (LOGGER_LOG)0x0) {
                (*p_Var15)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"parseDeviceTwinTopicInfo",0x266,1,
                           "requestId does not begin with string format %s","?$rid=");
              }
              break;
            }
            lVar25 = lVar25 + 1;
            iVar6 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar17,"/");
          } while (iVar6 == 0);
          pcVar12 = (char *)0x0;
          local_60 = 0;
          lVar25 = 0;
        }
LAB_0012f6b8:
        cVar4 = (char)lVar25;
        STRING_delete(pSVar17);
      }
      STRING_TOKENIZER_destroy(pSVar16);
    }
    if (cVar4 == '\0') {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) {
        return MQTT_CLIENT_ACK_NONE;
      }
      pcVar12 = "processTwinNotification";
      pcVar13 = "Failure: parsing device topic info";
      iVar6 = 0x72e;
    }
    else {
      pAVar23 = mqttmessage_getApplicationMsg(msgHandle);
      if (pAVar23 != (APP_PAYLOAD *)0x0) {
        if ((local_60 & 1) != 0) {
          (**(code **)((long)callbackCtx + 0x150))
                    (1,pAVar23->message,pAVar23->length,*(undefined8 *)((long)callbackCtx + 0x168));
          return MQTT_CLIENT_ACK_NONE;
        }
        Entry = *(PDLIST_ENTRY *)((long)callbackCtx + 0xd0);
        do {
          if (Entry == (PDLIST_ENTRY)((long)callbackCtx + 0xd0)) {
            return MQTT_CLIENT_ACK_NONE;
          }
          uVar1 = *(ushort *)&Entry[-2].Blink;
          if (pcVar12 == (char *)(ulong)uVar1) {
            DList_RemoveEntryList(Entry);
            if (*(int *)&Entry[-1].Blink == 1) {
              if (Entry[1].Flink == (DLIST_ENTRY_TAG *)0x0) {
                (**(code **)((long)callbackCtx + 0x150))
                          (0,pAVar23->message,pAVar23->length,
                           *(undefined8 *)((long)callbackCtx + 0x168));
                goto LAB_0012f803;
              }
              (*(code *)Entry[1].Flink)(0,pAVar23->message,pAVar23->length,Entry[1].Blink);
            }
            else {
              (**(code **)((long)callbackCtx + 0x148))
                        (*(undefined4 *)((long)&Entry[-2].Blink + 4),local_68,
                         *(undefined8 *)((long)callbackCtx + 0x168));
LAB_0012f803:
              subscribeToNotifyStateIfNeeded((PMQTTTRANSPORT_HANDLE_DATA)callbackCtx);
            }
            free(Entry + -3);
          }
          else {
            Entry = Entry->Flink;
          }
          if (pcVar12 == (char *)(ulong)uVar1) {
            return MQTT_CLIENT_ACK_NONE;
          }
        } while( true );
      }
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) {
        return MQTT_CLIENT_ACK_NONE;
      }
      pcVar12 = "processTwinNotification";
      pcVar13 = "Failure: invalid payload";
      iVar6 = 0x735;
    }
LAB_0012e68f:
    (*p_Var15)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,pcVar12,iVar6,1,pcVar13);
    return MQTT_CLIENT_ACK_NONE;
  }
  pAVar23 = mqttmessage_getApplicationMsg(msgHandle);
  if (pAVar23 == (APP_PAYLOAD *)0x0) {
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar12 = "processIncomingMessageNotification";
    pcVar13 = "Failure: invalid appPayload.";
    iVar6 = 0x7b6;
    goto LAB_0012e68f;
  }
  iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(pAVar23->message,pAVar23->length);
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar12 = "processIncomingMessageNotification";
    pcVar13 = "Failure: IotHub Message creation has failed.";
    iVar6 = 0x7ba;
    goto LAB_0012e68f;
  }
  if (iVar6 == 0) {
    pSVar17 = *(STRING_HANDLE *)((long)callbackCtx + 8);
LAB_0012e9b1:
    pcVar13 = STRING_c_str(pSVar17);
    sVar14 = strlen(pcVar13);
    pcVar12 = pcVar12 + (sVar14 - 1);
  }
  else {
    if (iVar6 == 3) {
      pSVar17 = *(STRING_HANDLE *)((long)callbackCtx + 0x20);
      goto LAB_0012e9b1;
    }
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (char *)0x0;
      (*p_Var15)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"findMessagePropertyStart",0x65c,1,"ERROR: type %d is not expected",
                 CONCAT44(uVar26,iVar6));
    }
  }
  if (pcVar12 == (char *)0x0) {
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 != (LOGGER_LOG)0x0) {
      pcVar12 = "Cannot find start of properties";
      iVar6 = 0x6d2;
LAB_0012f474:
      (*p_Var15)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"extractMqttProperties",iVar6,1,pcVar12);
    }
LAB_0012f484:
    pSVar17 = (STRING_HANDLE)0x0;
    pSVar16 = (STRING_TOKENIZER_HANDLE_conflict)0x0;
    goto LAB_0012f487;
  }
  if ((unaff_R12D & 1) != 0) {
    pcVar13 = strchr(pcVar12,0x2f);
    if ((pcVar13 == (char *)0x0) || (pcVar13[1] == '\0')) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        pcVar12 = "Cannot find \'/\' to mark beginning of input name";
        iVar6 = 0x596;
        goto LAB_0012ec55;
      }
LAB_0012ef04:
      pcVar18 = (char *)0x0;
LAB_0012ef07:
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar13 = pcVar13 + 1;
      pcVar12 = strchr(pcVar13,0x2f);
      if (pcVar12 == (char *)0x0) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012ef04;
        pcVar12 = "Cannot find \'/\' after input name";
        iVar6 = 0x59e;
LAB_0012ec55:
        pcVar18 = (char *)0x0;
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"addInputNamePropertyToMsg",iVar6,1,pcVar12);
        goto LAB_0012ef07;
      }
      sVar14 = (long)pcVar12 - (long)pcVar13;
      if (pcVar12 < pcVar13) {
        sVar14 = 0xffffffffffffffff;
      }
      sVar24 = sVar14 + 1;
      if (sVar24 == 0) {
        sVar24 = 0xffffffffffffffff;
      }
      if ((sVar24 == 0xffffffffffffffff) ||
         (pcVar18 = (char *)malloc(sVar24), pcVar18 == (char *)0x0)) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addInputNamePropertyToMsg",0x5a8,1,"Cannot allocate input name, size:%zu",
                     sVar24);
        }
        pcVar18 = (char *)0x0;
        pcVar12 = (char *)0x0;
      }
      else {
        memcpy(pcVar18,pcVar13,sVar14);
        pcVar18[sVar14] = '\0';
        IVar8 = IoTHubMessage_SetInputName(iotHubMessageHandle,pcVar18);
        if (IVar8 == IOTHUB_MESSAGE_OK) {
          pcVar12 = pcVar12 + 1;
        }
        else {
          p_Var15 = xlogging_get_log_function();
          if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012ef07;
          pcVar12 = (char *)0x0;
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addInputNamePropertyToMsg",0x5b2,1,"Failed adding input name to msg");
        }
      }
    }
    free(pcVar18);
    if (pcVar12 == (char *)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        pcVar12 = "failure adding input name to property.";
        iVar6 = 0x6d7;
        goto LAB_0012f474;
      }
      goto LAB_0012f484;
    }
  }
  if (*pcVar12 == '\0') {
    pSVar17 = (STRING_HANDLE)0x0;
    pSVar16 = (STRING_TOKENIZER_HANDLE_conflict)0x0;
LAB_0012f3d2:
    STRING_delete(pSVar17);
    STRING_TOKENIZER_destroy(pSVar16);
LAB_0012f3e7:
    dispositionContext = (MESSAGE_DISPOSITION_CONTEXT_HANDLE)malloc(8);
    if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"createMessageDispositionContext",0x7a1,1,
                   "Failed allocating MESSAGE_DISPOSITION_CONTEXT");
      }
    }
    else {
      uVar5 = mqttmessage_getPacketId(msgHandle);
      dispositionContext->packet_id = uVar5;
      QVar11 = mqttmessage_getQosType(msgHandle);
      dispositionContext->qos_value = QVar11;
    }
    if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012f4cb;
      pcVar12 = "failed creating message disposition context";
      iVar6 = 0x7c7;
    }
    else {
      IVar8 = IoTHubMessage_SetDispositionContext
                        (iotHubMessageHandle,dispositionContext,destroyMessageDispositionContext);
      if (IVar8 != IOTHUB_MESSAGE_OK) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          (*p_Var15)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processIncomingMessageNotification",0x7cc,1,
                     "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE");
        }
        free(dispositionContext);
        goto LAB_0012f4cb;
      }
      if ((unaff_R12D & 1) == 0) {
        cVar4 = (**(code **)((long)callbackCtx + 0x128))
                          (iotHubMessageHandle,*(undefined8 *)((long)callbackCtx + 0x168));
        if (cVar4 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012f4cb;
        pcVar12 = "IoTHubClientCore_LL_MessageCallback returned false";
        iVar6 = 0x7e0;
      }
      else {
        cVar4 = (**(code **)((long)callbackCtx + 0x120))();
        if (cVar4 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012f4cb;
        pcVar12 = "IoTHubClientCore_LL_MessageCallbackFromInput returned false";
        iVar6 = 0x7d6;
      }
    }
  }
  else {
    pSVar16 = STRING_TOKENIZER_create_from_char(pcVar12);
    if (pSVar16 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 != (LOGGER_LOG)0x0) {
        pcVar12 = "failure allocating tokenizer";
        iVar6 = 0x6e1;
        goto LAB_0012f474;
      }
      goto LAB_0012f484;
    }
    pSVar17 = STRING_new();
    if (pSVar17 == (STRING_HANDLE)0x0) {
      p_Var15 = xlogging_get_log_function();
      if (p_Var15 == (LOGGER_LOG)0x0) {
        pSVar17 = (STRING_HANDLE)0x0;
      }
      else {
        pcVar12 = "Failure to allocate STRING_new.";
        pSVar17 = (STRING_HANDLE)0x0;
        iVar6 = 0x6e6;
LAB_0012f64d:
        (*p_Var15)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"extractMqttProperties",iVar6,1,pcVar12);
      }
LAB_0012f487:
      STRING_delete(pSVar17);
      STRING_TOKENIZER_destroy(pSVar16);
    }
    else {
      handle = IoTHubMessage_Properties(iotHubMessageHandle);
      if (handle == (MAP_HANDLE)0x0) {
        p_Var15 = xlogging_get_log_function();
        if (p_Var15 != (LOGGER_LOG)0x0) {
          pcVar12 = "Failure to retrieve IoTHubMessage_properties.";
          iVar6 = 0x6eb;
          goto LAB_0012f64d;
        }
        goto LAB_0012f487;
      }
      iVar6 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar17,"&");
      if (iVar6 != 0) goto LAB_0012f3d2;
      do {
        pcVar12 = STRING_c_str(pSVar17);
        iVar6 = 0;
        if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
          pcVar13 = strchr(pcVar12,0x3d);
          iVar6 = 0;
          if ((pcVar13 != (char *)0x0) && (pcVar13[1] != '\0')) {
            pcVar18 = pcVar13 + 1;
            sVar14 = (long)pcVar13 - (long)pcVar12;
            lVar25 = 8;
            do {
              pcVar13 = *(char **)((long)&symm_key_interface.hsm_client_set_symm_key_info + lVar25);
              sVar24 = strlen(pcVar13);
              if ((sVar24 == sVar14) && (iVar6 = bcmp(pcVar12,pcVar13,sVar14), iVar6 == 0)) {
                propertyType = *(IOTHUB_SYSTEM_PROPERTY_TYPE *)
                                ((long)&sysPropList[0].propName + lVar25);
                goto LAB_0012f037;
              }
              lVar25 = lVar25 + 0x10;
            } while (lVar25 != 0xe8);
            propertyType = IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM;
LAB_0012f037:
            iVar6 = 0;
            if (propertyType != IOTHUB_SYSTEM_PROPERTY_TYPE_SILENTLY_IGNORE) {
              if (propertyType == IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM) {
                sVar24 = sVar14 + 1;
                if (sVar24 == 0) {
                  sVar24 = 0xffffffffffffffff;
                }
                if (sVar24 == 0xffffffffffffffff) {
LAB_0012f1d9:
                  p_Var15 = xlogging_get_log_function();
                  iVar6 = 0x675;
                  if (p_Var15 != (LOGGER_LOG)0x0) {
                    (*p_Var15)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addApplicationPropertyToMessage",0x674,1,
                               "Failed allocating property information, size:%zu",sVar24);
                  }
                  pcVar13 = (char *)0x0;
                }
                else {
                  cVar4 = *(char *)((long)callbackCtx + 0x108);
                  pcVar13 = (char *)malloc(sVar24);
                  if (pcVar13 == (char *)0x0) goto LAB_0012f1d9;
                  memcpy(pcVar13,pcVar12,sVar14);
                  pcVar13[sVar14] = '\0';
                  if (cVar4 == '\0') {
                    MVar9 = Map_AddOrUpdate(handle,pcVar13,pcVar18);
                    iVar6 = 0;
                    if (MVar9 != MAP_OK) {
                      p_Var15 = xlogging_get_log_function();
                      iVar6 = 0x694;
                      if (p_Var15 != (LOGGER_LOG)0x0) {
                        (*p_Var15)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addApplicationPropertyToMessage",0x693,1,
                                   "Map_AddOrUpdate failed.");
                      }
                    }
                  }
                  else {
                    pSVar21 = URL_DecodeString(pcVar13);
                    pSVar22 = URL_DecodeString(pcVar18);
                    if ((pSVar21 == (STRING_HANDLE)0x0) || (pSVar22 == (STRING_HANDLE)0x0)) {
                      p_Var15 = xlogging_get_log_function();
                      iVar6 = 0x683;
                      if (p_Var15 != (LOGGER_LOG)0x0) {
                        iVar10 = 0x682;
                        pcVar12 = "Failed to URL decode property";
LAB_0012f364:
                        (*p_Var15)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addApplicationPropertyToMessage",iVar10,1,pcVar12);
                      }
                    }
                    else {
                      pcVar12 = STRING_c_str(pSVar21);
                      pcVar18 = STRING_c_str(pSVar22);
                      MVar9 = Map_AddOrUpdate(handle,pcVar12,pcVar18);
                      iVar6 = 0;
                      if (MVar9 != MAP_OK) {
                        p_Var15 = xlogging_get_log_function();
                        iVar6 = 0x688;
                        if (p_Var15 != (LOGGER_LOG)0x0) {
                          iVar10 = 0x687;
                          pcVar12 = "Map_AddOrUpdate failed.";
                          goto LAB_0012f364;
                        }
                      }
                    }
                    STRING_delete(pSVar22);
                    STRING_delete(pSVar21);
                  }
                }
                free(pcVar13);
              }
              else if (*(char *)((long)callbackCtx + 0x108) == '\x01') {
                pSVar21 = URL_DecodeString(pcVar18);
                if (pSVar21 == (STRING_HANDLE)0x0) {
                  p_Var15 = xlogging_get_log_function();
                  iVar6 = 0x6aa;
                  if (p_Var15 != (LOGGER_LOG)0x0) {
                    (*p_Var15)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6a9,1,
                               "Failed to URL decode property value");
                  }
                }
                else {
                  pcVar12 = STRING_c_str(pSVar21);
                  iVar6 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar12);
                  if (iVar6 == 0) {
                    iVar6 = 0;
                  }
                  else {
                    p_Var15 = xlogging_get_log_function();
                    iVar6 = 0x6af;
                    if (p_Var15 != (LOGGER_LOG)0x0) {
                      (*p_Var15)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6ae,1,
                                 "Unable to set message property");
                    }
                  }
                }
                STRING_delete(pSVar21);
              }
              else {
                iVar10 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar18);
                iVar6 = 0;
                if (iVar10 != 0) {
                  p_Var15 = xlogging_get_log_function();
                  iVar6 = 0x6b8;
                  if (p_Var15 != (LOGGER_LOG)0x0) {
                    (*p_Var15)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6b7,1,
                               "Unable to set message property");
                  }
                }
              }
            }
          }
        }
        iVar10 = STRING_TOKENIZER_get_next_token(pSVar16,pSVar17,"&");
      } while (iVar10 == 0 && iVar6 == 0);
      STRING_delete(pSVar17);
      STRING_TOKENIZER_destroy(pSVar16);
      if (iVar6 == 0) goto LAB_0012f3e7;
    }
    p_Var15 = xlogging_get_log_function();
    if (p_Var15 == (LOGGER_LOG)0x0) goto LAB_0012f4cb;
    pcVar12 = "failure extracting mqtt properties.";
    iVar6 = 0x7be;
  }
  (*p_Var15)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
             ,"processIncomingMessageNotification",iVar6,1,pcVar12);
LAB_0012f4cb:
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return MQTT_CLIENT_ACK_NONE;
}

Assistant:

static MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle, void* callbackCtx)
{
    if (msgHandle != NULL && callbackCtx != NULL)
    {
        PMQTTTRANSPORT_HANDLE_DATA transportData = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
        IOTHUB_IDENTITY_TYPE type;

        const char* topicName = mqttmessage_getTopicName(msgHandle);
        if (topicName == NULL)
        {
            LogError("Failure: NULL topic name encountered");
        }
        else if (retrieveTopicType(transportData, topicName, &type) != 0)
        {
            LogError("Received unexpected topic.  Ignoring remainder of request");
        }
        else
        {
            if (type == IOTHUB_TYPE_DEVICE_TWIN)
            {
                processTwinNotification(transportData, msgHandle, topicName);
            }
            else if (type == IOTHUB_TYPE_DEVICE_METHODS)
            {
                processDeviceMethodNotification(transportData, msgHandle, topicName);
            }
            else
            {
                processIncomingMessageNotification(transportData, msgHandle, topicName, type);
            }
        }
    }

    return MQTT_CLIENT_ACK_NONE;
}